

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner_unix.cpp
# Opt level: O3

void __thiscall trun::DirScanner::CheckAddFile(DirScanner *this,string *filename)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  GetExtension(&local_38,this,filename);
  bVar1 = IsExtensionOk(this,&local_38);
  if (bVar1) {
    __s = realpath((filename->_M_dataplus)._M_p,(char *)0x0);
    if (__s != (char *)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->filenames,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DirScanner::CheckAddFile(std::string &filename) {
    std::string ext = GetExtension(filename);
    if (IsExtensionOk(ext)) {
        // Need proper path to file
        char *fullPath = realpath(filename.c_str(),NULL);
        if (fullPath != nullptr) {
            filenames.push_back(std::string(fullPath));
        }
    }
}